

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_tests.cc
# Opt level: O0

void lf::assemble::test::linfe_boundary_assembly
               (shared_ptr<lf::mesh::Mesh> *mesh_p,DofHandler *dof_handler)

{
  pointer *this;
  Index *this_00;
  double lhs_value;
  uint uVar1;
  bool bVar2;
  ostream *poVar3;
  Message *pMVar4;
  char *pcVar5;
  undefined4 extraout_var;
  element_type *peVar6;
  void *this_01;
  Index IVar7;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar8;
  Scalar *pSVar9;
  reference pvVar10;
  AssertHelper local_568;
  char local_559;
  Message local_558;
  undefined1 local_550 [8];
  AssertionResult gtest_ar_2;
  int j;
  int i;
  Scalar local_530;
  Scalar local_528;
  Scalar local_520;
  Scalar local_518;
  Scalar local_510;
  Scalar local_508;
  Scalar local_500;
  Scalar local_4f8;
  Scalar local_4f0;
  Scalar local_4e8;
  Scalar local_4e0;
  Scalar local_4d8;
  Scalar local_4d0;
  Scalar local_4c8;
  Scalar local_4c0;
  Scalar local_4b8;
  Scalar local_4b0;
  Scalar local_4a8;
  Scalar local_4a0;
  Scalar local_498;
  Scalar local_490;
  Scalar local_488;
  Scalar local_480;
  Scalar local_478;
  Scalar local_470;
  Scalar local_468;
  Scalar local_460;
  Scalar local_458;
  Scalar local_450;
  Scalar local_448;
  Scalar local_440;
  Scalar local_438;
  Scalar local_430;
  Scalar local_428;
  Scalar local_420;
  Scalar local_418;
  Scalar local_410;
  Scalar local_408;
  Scalar local_400;
  Scalar local_3f8;
  Scalar local_3f0;
  Scalar local_3e8;
  Scalar local_3e0;
  Scalar local_3d8;
  Scalar local_3d0;
  Scalar local_3c8;
  Scalar local_3c0;
  Scalar local_3b8;
  Scalar local_3b0;
  Scalar local_3a8;
  Scalar local_3a0;
  Scalar local_398;
  Scalar local_390;
  Scalar local_388;
  Scalar local_380;
  Scalar local_378;
  Scalar local_370;
  Scalar local_368;
  Scalar local_360;
  Scalar local_358;
  Scalar local_350;
  Scalar local_348;
  Scalar local_340;
  Scalar local_338;
  Scalar local_330;
  Scalar local_328;
  Scalar local_320;
  Scalar local_318;
  Scalar local_310;
  Scalar local_308;
  Scalar local_300;
  Scalar local_2f8;
  Scalar local_2f0;
  Scalar local_2e8;
  Scalar local_2e0;
  Scalar local_2d8;
  Scalar local_2d0;
  Scalar local_2c8;
  Scalar local_2c0;
  Scalar local_2b8;
  Scalar local_2b0;
  Scalar local_2a8;
  Scalar local_2a0;
  Scalar local_298;
  Scalar local_290;
  Scalar local_288;
  Scalar local_280;
  Scalar local_278;
  Scalar local_270;
  Scalar local_268;
  Scalar local_260;
  Scalar local_258;
  Scalar local_250;
  Scalar local_248;
  Scalar local_240;
  Scalar local_238;
  Scalar local_230;
  Scalar local_228;
  Scalar local_220;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_218;
  int local_1f8 [2];
  undefined1 local_1f0 [8];
  MatrixXd ref_mat;
  MatrixXd dense_Gal_mat;
  SparseMatrix<double,_0,_int> Galerkin_matrix;
  undefined1 local_158 [8];
  COOMatrix<double> mat;
  undefined1 local_128 [8];
  BoundaryAssembler assembler;
  glb_idx_t e_idx;
  RefEl local_a1;
  Message local_a0;
  RefEl local_92;
  RefEl local_91;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  Entity *e;
  gdof_idx_t dof_idx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> dof_to_entity_index;
  Message local_50 [3];
  int local_34;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  size_type N_dofs;
  DofHandler *dof_handler_local;
  shared_ptr<lf::mesh::Mesh> *mesh_p_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = (*dof_handler->_vptr_DofHandler[2])();
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (&std::cout,
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_);
  poVar3 = std::operator<<(poVar3," degrees of freedom in linear FE space");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_34 = 10;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_30,"N_dofs","10",
             (uint *)((long)&gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl + 4),&local_34);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar2) {
    testing::Message::Message(local_50);
    pMVar4 = testing::Message::operator<<(local_50,(char (*) [24])"Dubious numbers of dofs");
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &dof_to_entity_index.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/test/assembly_tests.cc"
               ,0x213,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &dof_to_entity_index.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,pMVar4);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &dof_to_entity_index.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  memset(&dof_idx,0,0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dof_idx);
  for (e = (Entity *)0x0;
      (long)e < (long)(ulong)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_; e = (Entity *)((long)&e->_vptr_Entity + 1)) {
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = (*dof_handler->_vptr_DofHandler[7])(dof_handler,e);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = extraout_var;
    local_91.type_ =
         (**(code **)(*(long *)gtest_ar_1.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl + 0x20))();
    local_92 = lf::base::RefEl::kPoint();
    testing::internal::EqHelper::Compare<lf::base::RefEl,_lf::base::RefEl,_nullptr>
              ((EqHelper *)local_90,"e.RefEl()","lf::base::RefEl::kPoint()",&local_91,&local_92);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar2) {
      testing::Message::Message(&local_a0);
      pMVar4 = testing::Message::operator<<(&local_a0,(char (*) [8])"dofs @ ");
      local_a1.type_ =
           (**(code **)(*(long *)gtest_ar_1.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl + 0x20))();
      pMVar4 = testing::Message::operator<<(pMVar4,&local_a1);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffff50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/test/assembly_tests.cc"
                 ,0x219,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff50,pMVar4);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff50);
      testing::Message::~Message(&local_a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
    peVar6 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)mesh_p);
    assembler._108_4_ =
         (*peVar6->_vptr_Mesh[5])
                   (peVar6,gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dof_idx,
               (value_type_conflict *)&assembler.field_0x6c);
    poVar3 = std::operator<<((ostream *)&std::cout,"dof ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(long)e);
    poVar3 = std::operator<<(poVar3," @node ");
    this_01 = (void *)std::ostream::operator<<(poVar3,assembler._108_4_);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  this = &mat.triplets_.
          super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::shared_ptr<lf::mesh::Mesh>::shared_ptr((shared_ptr<lf::mesh::Mesh> *)this,mesh_p);
  BoundaryAssembler::BoundaryAssembler
            ((BoundaryAssembler *)local_128,(shared_ptr<lf::mesh::Mesh> *)this);
  std::shared_ptr<lf::mesh::Mesh>::~shared_ptr
            ((shared_ptr<lf::mesh::Mesh> *)
             &mat.triplets_.
              super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  COOMatrix<double>::COOMatrix
            ((COOMatrix<double> *)local_158,
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl._4_4_,
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl._4_4_);
  AssembleMatrixLocally<lf::assemble::COOMatrix<double>,_lf::assemble::test::BoundaryAssembler>
            ((COOMatrix<double> *)&Galerkin_matrix.m_data.m_allocatedSize,1,dof_handler,
             (BoundaryAssembler *)local_128);
  this_00 = &Galerkin_matrix.m_data.m_allocatedSize;
  COOMatrix<double>::operator=((COOMatrix<double> *)local_158,(COOMatrix<double> *)this_00);
  COOMatrix<double>::~COOMatrix((COOMatrix<double> *)this_00);
  poVar3 = std::operator<<((ostream *)&std::cout,"Assembled ");
  IVar7 = COOMatrix<double>::rows((COOMatrix<double> *)local_158);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,IVar7);
  poVar3 = std::operator<<(poVar3,"x");
  IVar7 = COOMatrix<double>::cols((COOMatrix<double> *)local_158);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,IVar7);
  poVar3 = std::operator<<(poVar3," matrix");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  COOMatrix<double>::makeSparse
            ((SparseMatrix<double,_0,_int> *)
             &dense_Gal_mat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols,(COOMatrix<double> *)local_158);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::SparseMatrix<double,0,int>>
            ((Matrix<double,_1,_1,0,_1,_1> *)
             &ref_mat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols,(EigenBase<Eigen::SparseMatrix<double,_0,_int>_> *)
                     &dense_Gal_mat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                      .m_storage.m_cols);
  poVar3 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                             &ref_mat.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_cols);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_1f8[1] = 10;
  local_1f8[0] = 10;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_1f0,local_1f8 + 1,local_1f8);
  local_220 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
            (&local_218,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1f0,&local_220
            );
  local_228 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_218,&local_228);
  local_230 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_230);
  local_238 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_238);
  local_240 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_240);
  local_248 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_248);
  local_250 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_250);
  local_258 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_258);
  local_260 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_260);
  local_268 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_268);
  local_270 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_270);
  local_278 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_278);
  local_280 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_280);
  local_288 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_288);
  local_290 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_290);
  local_298 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_298);
  local_2a0 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_2a0);
  local_2a8 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_2a8);
  local_2b0 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_2b0);
  local_2b8 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_2b8);
  local_2c0 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_2c0);
  local_2c8 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_2c8);
  local_2d0 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_2d0);
  local_2d8 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_2d8);
  local_2e0 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_2e0);
  local_2e8 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_2e8);
  local_2f0 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_2f0);
  local_2f8 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_2f8);
  local_300 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_300);
  local_308 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_308);
  local_310 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_310);
  local_318 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_318);
  local_320 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_320);
  local_328 = 23.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_328);
  local_330 = -11.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_330);
  local_338 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_338);
  local_340 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_340);
  local_348 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_348);
  local_350 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_350);
  local_358 = -12.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_358);
  local_360 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_360);
  local_368 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_368);
  local_370 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_370);
  local_378 = -11.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_378);
  local_380 = 24.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_380);
  local_388 = -13.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_388);
  local_390 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_390);
  local_398 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_398);
  local_3a0 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_3a0);
  local_3a8 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_3a8);
  local_3b0 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_3b0);
  local_3b8 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_3b8);
  local_3c0 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_3c0);
  local_3c8 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_3c8);
  local_3d0 = -13.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_3d0);
  local_3d8 = 27.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_3d8);
  local_3e0 = -14.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_3e0);
  local_3e8 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_3e8);
  local_3f0 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_3f0);
  local_3f8 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_3f8);
  local_400 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_400);
  local_408 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_408);
  local_410 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_410);
  local_418 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_418);
  local_420 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_420);
  local_428 = -14.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_428);
  local_430 = 29.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_430);
  local_438 = -15.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_438);
  local_440 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_440);
  local_448 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_448);
  local_450 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_450);
  local_458 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_458);
  local_460 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_460);
  local_468 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_468);
  local_470 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_470);
  local_478 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_478);
  local_480 = -15.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_480);
  local_488 = 31.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_488);
  local_490 = -16.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_490);
  local_498 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_498);
  local_4a0 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_4a0);
  local_4a8 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_4a8);
  local_4b0 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_4b0);
  local_4b8 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_4b8);
  local_4c0 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_4c0);
  local_4c8 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_4c8);
  local_4d0 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_4d0);
  local_4d8 = -16.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_4d8);
  local_4e0 = 33.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_4e0);
  local_4e8 = -17.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_4e8);
  local_4f0 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_4f0);
  local_4f8 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_4f8);
  local_500 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_500);
  local_508 = -12.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_508);
  local_510 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_510);
  local_518 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_518);
  local_520 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_520);
  local_528 = 0.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_528);
  local_530 = -17.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar8,&local_530);
  _j = 29.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar8,(Scalar *)&j)
  ;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_218);
  for (gtest_ar_2.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl._4_4_ = 0;
      gtest_ar_2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ <
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_;
      gtest_ar_2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ =
           gtest_ar_2.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl._4_4_ + 1) {
    for (gtest_ar_2.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl._0_4_ = 0;
        (uint)gtest_ar_2.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl <
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_;
        gtest_ar_2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ =
             (uint)gtest_ar_2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl + 1) {
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                          &ref_mat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_cols,
                          (long)(int)gtest_ar_2.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                          (long)(int)(uint)gtest_ar_2.message_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl);
      lhs_value = *pSVar9;
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dof_idx,
                           (long)(int)gtest_ar_2.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._4_4_);
      uVar1 = *pvVar10;
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dof_idx,
                           (long)(int)(uint)gtest_ar_2.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl);
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_1f0,
                          (ulong)uVar1,(ulong)*pvVar10);
      testing::internal::CmpHelperFloatingPointEQ<double>
                ((internal *)local_550,"dense_Gal_mat(i, j)",
                 "ref_mat(dof_to_entity_index[i], dof_to_entity_index[j])",lhs_value,*pSVar9);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_550);
      if (!bVar2) {
        testing::Message::Message(&local_558);
        pMVar4 = testing::Message::operator<<(&local_558,(char (*) [21])" mismatch in entry (");
        pMVar4 = testing::Message::operator<<
                           (pMVar4,(int *)((long)&gtest_ar_2.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 4));
        local_559 = ',';
        pMVar4 = testing::Message::operator<<(pMVar4,&local_559);
        pMVar4 = testing::Message::operator<<(pMVar4,(int *)&gtest_ar_2.message_);
        pMVar4 = testing::Message::operator<<(pMVar4,(char (*) [2])0x4a0756);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_550);
        testing::internal::AssertHelper::AssertHelper
                  (&local_568,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/test/assembly_tests.cc"
                   ,0x23e,pcVar5);
        testing::internal::AssertHelper::operator=(&local_568,pMVar4);
        testing::internal::AssertHelper::~AssertHelper(&local_568);
        testing::Message::~Message(&local_558);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_550);
    }
  }
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_1f0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &ref_mat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols);
  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
            ((SparseMatrix<double,_0,_int> *)
             &dense_Gal_mat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols);
  COOMatrix<double>::~COOMatrix((COOMatrix<double> *)local_158);
  BoundaryAssembler::~BoundaryAssembler((BoundaryAssembler *)local_128);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dof_idx);
  return;
}

Assistant:

void linfe_boundary_assembly(std::shared_ptr<lf::mesh::Mesh> mesh_p,
                             const lf::assemble::DofHandler &dof_handler) {
  const lf::assemble::size_type N_dofs(dof_handler.NumDofs());

  std::cout << N_dofs << " degrees of freedom in linear FE space" << std::endl;
  EXPECT_EQ(N_dofs, 10) << "Dubious numbers of dofs";

  // Output/store index numbers of entities holding global shape functions
  std::vector<lf::base::glb_idx_t> dof_to_entity_index{};
  for (lf::assemble::gdof_idx_t dof_idx = 0; dof_idx < N_dofs; dof_idx++) {
    const lf::mesh::Entity &e(dof_handler.Entity(dof_idx));
    EXPECT_EQ(e.RefEl(), lf::base::RefEl::kPoint()) << "dofs @ " << e.RefEl();
    const lf::base::glb_idx_t e_idx(mesh_p->Index(e));
    dof_to_entity_index.push_back(e_idx);
    std::cout << "dof " << dof_idx << " @node " << e_idx << std::endl;
  }

  // Test assembler
  BoundaryAssembler assembler{mesh_p};
  lf::assemble::COOMatrix<double> mat(N_dofs, N_dofs);

  // Assembly over edges
  mat = lf::assemble::AssembleMatrixLocally<lf::assemble::COOMatrix<double>>(
      1, dof_handler, assembler);

  std::cout << "Assembled " << mat.rows() << "x" << mat.cols() << " matrix"
            << std::endl;

  // Build sparse matrix from COO format
  Eigen::SparseMatrix<double> Galerkin_matrix = mat.makeSparse();

  // Convert Galerkin matrix to a dense matrix
  Eigen::MatrixXd dense_Gal_mat = Galerkin_matrix;

  // Output Galerkin matrix
  std::cout << dense_Gal_mat << std::endl;

  // Reference Galerkin matrix
  Eigen::MatrixXd ref_mat(10, 10);
  ref_mat << 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
      0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 23, -11, 0, 0, 0, 0, -12, 0, 0, 0, -11,
      24, -13, 0, 0, 0, 0, 0, 0, 0, 0, -13, 27, -14, 0, 0, 0, 0, 0, 0, 0, 0,
      -14, 29, -15, 0, 0, 0, 0, 0, 0, 0, 0, -15, 31, -16, 0, 0, 0, 0, 0, 0, 0,
      0, -16, 33, -17, 0, 0, 0, -12, 0, 0, 0, 0, -17, 29;

  for (int i = 0; i < N_dofs; ++i) {
    for (int j = 0; j < N_dofs; ++j) {
      EXPECT_DOUBLE_EQ(dense_Gal_mat(i, j),
                       ref_mat(dof_to_entity_index[i], dof_to_entity_index[j]))
          << " mismatch in entry (" << i << ',' << j << ")";
    }
  }
}